

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>::
Flush<duckdb::BitpackingCompressionState<duckdb::hugeint_t,true,duckdb::hugeint_t>::BitpackingWriter>
          (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t> *this)

{
  bool bVar1;
  BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t> BVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  unsigned_long uVar6;
  bool bVar7;
  ulong uVar8;
  hugeint_t frame_of_reference;
  void *in_stack_ffffffffffffffc0;
  
  bVar7 = true;
  if (*(long *)(this + 0x10818) == 0) {
    return true;
  }
  if (((this[0x108a1] != (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)0x0) ||
      (bVar1 = hugeint_t::operator==((hugeint_t *)(this + 0x10840),(hugeint_t *)(this + 0x10830)),
      bVar1)) && ((byte)((char)this[0x108a4] - 1U) < 2)) {
    BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
    WriteConstant(*(hugeint_t *)(this + 0x10840),*(idx_t *)(this + 0x10818),
                  *(void **)(this + 0x10828),(bool)this[0x108a1]);
    *(long *)(this + 0x10820) = *(long *)(this + 0x10820) + 0x14;
    return true;
  }
  BVar2 = (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)
          TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (*(hugeint_t *)(this + 0x10840),*(hugeint_t *)(this + 0x10830),
                     (hugeint_t *)(this + 0x10850));
  this[0x108a3] = BVar2;
  BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::CalculateDeltaStats
            ((BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)this);
  if (this[0x108a2] == (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)0x1) {
    bVar1 = hugeint_t::operator==((hugeint_t *)(this + 0x10870),(hugeint_t *)(this + 0x10860));
    if ((bVar1) && (((byte)this[0x108a4] & 0xfe) != 4)) {
      BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
      WriteConstantDelta(*(hugeint_t *)(this + 0x10870),**(hugeint_t **)(this + 0x8010),
                         *(idx_t *)(this + 0x10818),*(hugeint_t **)(this + 0x8010),
                         (bool *)(this + 0x10018),*(void **)(this + 0x10828));
      *(long *)(this + 0x10820) = *(long *)(this + 0x10820) + 0x24;
      return true;
    }
    bVar3 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::hugeint_t,false,false>
                      (*(hugeint_t *)(this + 0x10880),*(hugeint_t *)(this + 0x10880));
    bVar4 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::hugeint_t,true,false>
                      (*(hugeint_t *)(this + 0x10850),*(hugeint_t *)(this + 0x10850));
    if ((bVar3 < bVar4) &&
       (this[0x108a4] != (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)0x5)) {
      BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::
      SubtractFrameOfReference<duckdb::hugeint_t>
                ((BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)this,
                 (hugeint_t *)(this + 0x8018),*(hugeint_t *)(this + 0x10860));
      BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
      WriteDeltaFor((hugeint_t *)(this + 0x8018),(bool *)(this + 0x10018),bVar3,
                    *(hugeint_t *)(this + 0x10860),*(hugeint_t *)(this + 0x10890),
                    *(hugeint_t **)(this + 0x8010),*(idx_t *)(this + 0x10818),
                    *(void **)(this + 0x10828));
      uVar8 = *(ulong *)(this + 0x10818);
      lVar5 = *(long *)(this + 0x10820) + 0x28;
      *(long *)(this + 0x10820) = lVar5;
      if ((uVar8 & 0x1f) != 0) {
        uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar8 & 0x1f);
        uVar8 = (uVar8 - uVar6) + 0x20;
        lVar5 = *(long *)(this + 0x10820);
      }
      *(ulong *)(this + 0x10820) = (bVar3 * uVar8 >> 3) + lVar5;
      return true;
    }
  }
  if (this[0x108a3] == (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)0x1) {
    bVar3 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::hugeint_t,false,false>
                      (*(hugeint_t *)(this + 0x10850),*(hugeint_t *)(this + 0x10850));
    BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::
    SubtractFrameOfReference<duckdb::hugeint_t>
              ((BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)this,
               *(hugeint_t **)(this + 0x8010),*(hugeint_t *)(this + 0x10830));
    frame_of_reference.upper = *(int64_t *)(this + 0x10818);
    frame_of_reference.lower = *(uint64_t *)(this + 0x10838);
    BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
    WriteFor(*(BitpackingWriter **)(this + 0x8010),(hugeint_t *)(this + 0x10018),
             (bool *)(ulong)bVar3,(bitpacking_width_t)*(undefined8 *)(this + 0x10830),
             frame_of_reference,*(idx_t *)(this + 0x10828),in_stack_ffffffffffffffc0);
    uVar8 = *(ulong *)(this + 0x10818);
    if ((uVar8 & 0x1f) != 0) {
      uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar8 & 0x1f);
      uVar8 = (uVar8 - uVar6) + 0x20;
    }
    *(ulong *)(this + 0x10820) =
         *(long *)(this + 0x10820) + ((long)(ulong)bVar3 * uVar8 >> 3) + 0x18;
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}